

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solution.cpp
# Opt level: O3

void __thiscall Solution::createNursesAndTurns(Solution *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pNVar2;
  pointer pcVar3;
  pointer pbVar4;
  _Rb_tree_node_base *p_Var5;
  int iVar6;
  Scenario *pSVar7;
  vector<Nurse,_std::allocator<Nurse>_> *pvVar8;
  string *psVar9;
  NurseSolution *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
  *pmVar10;
  ShiftType *this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar11;
  Turn *this_02;
  _Base_ptr p_Var12;
  pointer this_03;
  ShiftType *this_04;
  int day;
  pointer pbVar13;
  Turn *turn;
  vector<Turn_*,_std::allocator<Turn_*>_> shifts;
  string skill;
  Turn *local_e0;
  value_type local_d8;
  string local_b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>
  local_98;
  _Rb_tree_node_base *local_38;
  
  pSVar7 = Scenario::getInstance();
  pvVar8 = Scenario::getNurses(pSVar7);
  this_03 = (pvVar8->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pNVar2 = (pvVar8->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (this_03 != pNVar2) {
    paVar1 = &local_98.first.field_2;
    do {
      psVar9 = Nurse::getId_abi_cxx11_(this_03);
      this_00 = (NurseSolution *)operator_new(0x20);
      NurseSolution::NurseSolution(this_00,this_03);
      pcVar3 = (psVar9->_M_dataplus)._M_p;
      local_98.first._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,pcVar3,pcVar3 + psVar9->_M_string_length);
      local_98.second.id._M_dataplus._M_p = (pointer)this_00;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,NurseSolution*>,std::_Select1st<std::pair<std::__cxx11::string_const,NurseSolution*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,NurseSolution*>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,NurseSolution*>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,NurseSolution*>,std::_Select1st<std::pair<std::__cxx11::string_const,NurseSolution*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,NurseSolution*>>>
                  *)&this->nurses,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>
                  *)&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.first._M_dataplus._M_p != paVar1) {
        operator_delete(local_98.first._M_dataplus._M_p,
                        local_98.first.field_2._M_allocated_capacity + 1);
      }
      this_03 = this_03 + 1;
    } while (this_03 != pNVar2);
  }
  day = 0;
  do {
    local_d8.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_d8.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (Turn **)0x0;
    local_d8.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (Turn **)0x0;
    pSVar7 = Scenario::getInstance();
    pmVar10 = Scenario::getShifts_abi_cxx11_(pSVar7);
    p_Var12 = (pmVar10->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_38 = &(pmVar10->_M_t)._M_impl.super__Rb_tree_header._M_header;
    if (p_Var12 != local_38) {
      do {
        this_04 = &local_98.second;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>
        ::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_true>
                  (&local_98,
                   (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>
                    *)(p_Var12 + 1));
        this_01 = (ShiftType *)operator_new(0x40);
        psVar9 = ShiftType::getId_abi_cxx11_(this_04);
        iVar6 = ShiftType::getMinimumNumberOfConsecutiveAssignments(this_04);
        local_b8._M_dataplus._M_p._0_4_ = iVar6;
        iVar6 = ShiftType::getMaximumNumberOfConsecutiveAssignments(this_04);
        local_e0 = (Turn *)CONCAT44(local_e0._4_4_,iVar6);
        ShiftType::ShiftType(this_01,psVar9,(int *)&local_b8,(int *)&local_e0);
        pvVar11 = ShiftType::getForbiddenSucceedingShiftTypes_abi_cxx11_(this_04);
        ShiftType::setForbidden(this_01,pvVar11);
        pSVar7 = Scenario::getInstance();
        pvVar11 = Scenario::getSkills_abi_cxx11_(pSVar7);
        pbVar4 = (pvVar11->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar13 = (pvVar11->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar4;
            pbVar13 = pbVar13 + 1) {
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          pcVar3 = (pbVar13->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b8,pcVar3,pcVar3 + pbVar13->_M_string_length);
          this_02 = (Turn *)operator_new(0x50);
          Turn::Turn(this_02,day,&local_b8,this_01);
          local_e0 = this_02;
          if (local_d8.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_d8.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<Turn*,std::allocator<Turn*>>::_M_realloc_insert<Turn*const&>
                      ((vector<Turn*,std::allocator<Turn*>> *)&local_d8,
                       (iterator)
                       local_d8.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_e0);
          }
          else {
            *local_d8.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
             super__Vector_impl_data._M_finish = this_02;
            local_d8.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_d8.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_98.second.forbiddenSucceedingShiftTypes);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98.second.id._M_dataplus._M_p != &local_98.second.id.field_2) {
          operator_delete(local_98.second.id._M_dataplus._M_p,
                          local_98.second.id.field_2._M_allocated_capacity + 1);
        }
        p_Var5 = local_38;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98.first._M_dataplus._M_p != &local_98.first.field_2) {
          operator_delete(local_98.first._M_dataplus._M_p,
                          local_98.first.field_2._M_allocated_capacity + 1);
        }
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
      } while (p_Var12 != p_Var5);
    }
    std::
    vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
    ::push_back(&this->turns,&local_d8);
    if (local_d8.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_d8.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d8.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    day = day + 1;
  } while (day != 7);
  return;
}

Assistant:

void Solution::createNursesAndTurns() {
    //create list of nurses with solution
    for (const Nurse &sce_nurses : Scenario::getInstance()->getNurses())
        nurses.insert(make_pair(sce_nurses.getId(),new NurseSolution(&sce_nurses)));

    using req_map = unordered_map<string, unordered_map<ShiftType*, vector<DayRequirement*>>>;

    //hardcoded size of week
    for(int j = 0; j < 7; j++) {
        vector<Turn *> shifts;

        for (pair<string,ShiftType> const &shift :  Scenario::getInstance()->getShifts()) {
            ShiftType* shiftType = new ShiftType(shift.second.getId(),shift.second.getMinimumNumberOfConsecutiveAssignments(),shift.second.getMaximumNumberOfConsecutiveAssignments());
            shiftType->setForbidden(shift.second.getForbiddenSucceedingShiftTypes());
            for(string skill : Scenario::getInstance()->getSkills()) {
                Turn *turn = new Turn(j, skill, shiftType);
                shifts.push_back(turn);
            }
        }
        turns.push_back(shifts);
    }
}